

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sign.cc
# Opt level: O2

int ASN1_item_sign(ASN1_ITEM *it,X509_ALGOR *algor1,X509_ALGOR *algor2,ASN1_BIT_STRING *signature,
                  void *data,EVP_PKEY *pkey,EVP_MD *type)

{
  int iVar1;
  int iVar2;
  ScopedEVP_MD_CTX ctx;
  
  if (signature->type == 3) {
    EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
    iVar2 = 0;
    iVar1 = EVP_DigestSignInit((EVP_MD_CTX *)&ctx,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,pkey);
    if (iVar1 != 0) {
      iVar2 = ASN1_item_sign_ctx(it,algor1,algor2,signature,data,(EVP_MD_CTX *)&ctx);
    }
    EVP_MD_CTX_cleanup((EVP_MD_CTX *)&ctx);
  }
  else {
    iVar2 = 0;
    ERR_put_error(0xc,0,0xbf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/a_sign.cc"
                  ,0x1f);
  }
  return iVar2;
}

Assistant:

int ASN1_item_sign(const ASN1_ITEM *it, X509_ALGOR *algor1, X509_ALGOR *algor2,
                   ASN1_BIT_STRING *signature, void *asn, EVP_PKEY *pkey,
                   const EVP_MD *type) {
  if (signature->type != V_ASN1_BIT_STRING) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
    return 0;
  }
  bssl::ScopedEVP_MD_CTX ctx;
  if (!EVP_DigestSignInit(ctx.get(), nullptr, type, nullptr, pkey)) {
    return 0;
  }
  return ASN1_item_sign_ctx(it, algor1, algor2, signature, asn, ctx.get());
}